

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O0

Bend * __thiscall
OpenMD::MoleculeCreator::createBend
          (MoleculeCreator *this,ForceField *ff,Molecule *mol,BendStamp *stamp,
          LocalIndexManager *localIndexMan)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  int index;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Bend *pBVar8;
  uint *puVar9;
  reference pvVar10;
  Atom *pAVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  BendStamp *in_RCX;
  string s;
  OpenMDException *e_1;
  DirectionalAtom *ghostAtom;
  Atom *normalAtom;
  int normalIndex;
  int ghostIndex;
  OpenMDException *e;
  Atom *atomC;
  Atom *atomB;
  Atom *atomA;
  vector<int,_std::allocator<int>_> bendAtoms;
  Bend *bend;
  BendType *bendType;
  BendTypeParser btParser;
  Molecule *in_stack_fffffffffffffaa8;
  Molecule *in_stack_fffffffffffffab0;
  Atom *in_stack_fffffffffffffab8;
  GhostBend *in_stack_fffffffffffffac0;
  Bend *this_00;
  BendType *in_stack_fffffffffffffae0;
  errorStruct *peVar12;
  Atom *in_stack_fffffffffffffae8;
  Atom *in_stack_fffffffffffffaf0;
  Atom *in_stack_fffffffffffffaf8;
  Bend *in_stack_fffffffffffffb00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  errorStruct *in_stack_fffffffffffffb30;
  long *local_4c8;
  value_type local_4b0;
  uint in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [8];
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  string *in_stack_fffffffffffffd40;
  ForceField *in_stack_fffffffffffffd48;
  string local_278 [32];
  long *local_258;
  Atom *local_250;
  value_type local_248;
  uint local_244;
  string local_240 [32];
  string local_220 [32];
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [96];
  string local_c8 [32];
  Atom *local_a8;
  Atom *local_a0;
  Atom *local_98;
  vector<int,_std::allocator<int>_> local_80;
  Bend *local_68;
  BendType *local_60;
  BendStamp *local_20;
  
  local_20 = in_RCX;
  BendTypeParser::BendTypeParser((BendTypeParser *)in_stack_fffffffffffffd40);
  local_60 = (BendType *)0x0;
  local_68 = (Bend *)0x0;
  BendStamp::getMembers((BendStamp *)in_stack_fffffffffffffaa8);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_80);
  if (sVar4 == 3) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_80,0);
    local_98 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_80,1);
    local_a0 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    std::vector<int,_std::allocator<int>_>::operator[](&local_80,2);
    local_a8 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                   (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    bVar1 = BendStamp::hasOverride(local_20);
    if (bVar1) {
      BendStamp::getOverrideType_abi_cxx11_((BendStamp *)in_stack_fffffffffffffaa8);
      BendStamp::getOverridePars((BendStamp *)in_stack_fffffffffffffaa8);
      local_60 = BendTypeParser::parseTypeAndPars
                           ((BendTypeParser *)in_stack_fffffffffffffb30,
                            (string *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
                            in_stack_fffffffffffffb20);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
      std::__cxx11::string::~string(local_c8);
    }
    else {
      (*(local_98->super_StuntDouble)._vptr_StuntDouble[7])(local_148);
      std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                 (allocator<char> *)in_stack_fffffffffffffae0);
      (*(local_a0->super_StuntDouble)._vptr_StuntDouble[7])(local_190);
      std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                 (allocator<char> *)in_stack_fffffffffffffae0);
      (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_1d8);
      std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                 (allocator<char> *)in_stack_fffffffffffffae0);
      local_60 = ForceField::getBendType
                           (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                            in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator(&local_1d9);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator(&local_191);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator(&local_149);
      std::__cxx11::string::~string(local_148);
      if (local_60 == (BendType *)0x0) {
        (*(local_98->super_StuntDouble)._vptr_StuntDouble[7])(local_200);
        uVar5 = std::__cxx11::string::c_str();
        (*(local_a0->super_StuntDouble)._vptr_StuntDouble[7])(local_220);
        uVar6 = std::__cxx11::string::c_str();
        (*(local_a8->super_StuntDouble)._vptr_StuntDouble[7])(local_240);
        uVar7 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",uVar5,uVar6,
                 uVar7);
        std::__cxx11::string::~string(local_240);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string(local_200);
        painCave.isFatal = 1;
        simError();
      }
    }
    pBVar8 = (Bend *)operator_new(0x98);
    Bend::Bend(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffae8,in_stack_fffffffffffffae0);
    local_68 = pBVar8;
  }
  else {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_80);
    if (sVar4 == 2) {
      bVar1 = BendStamp::haveGhostVectorSource((BendStamp *)0x1e5844);
      in_stack_fffffffffffffb5c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffb5c);
      if (bVar1) {
        uVar3 = BendStamp::getGhostVectorSource((BendStamp *)0x1e586a);
        in_stack_fffffffffffffb58 = uVar3;
        local_244 = uVar3;
        puVar9 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_80,0);
        if (uVar3 == *puVar9) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,1);
          local_4b0 = *pvVar10;
        }
        else {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_80,0);
          local_4b0 = *pvVar10;
        }
        local_248 = local_4b0;
        local_250 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                        (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        pAVar11 = Molecule::getAtomAt(in_stack_fffffffffffffab0,
                                      (uint)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        if (pAVar11 == (Atom *)0x0) {
          local_4c8 = (long *)0x0;
        }
        else {
          local_4c8 = (long *)__dynamic_cast(pAVar11,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
        }
        local_258 = local_4c8;
        if (local_4c8 == (long *)0x0) {
          in_stack_fffffffffffffb30 = &painCave;
          snprintf(painCave.errMsg,2000,"Can not cast Atom to DirectionalAtom");
          in_stack_fffffffffffffb30->isFatal = 1;
          simError();
        }
        uVar2 = BendStamp::hasOverride(local_20);
        if ((bool)uVar2) {
          BendStamp::getOverrideType_abi_cxx11_((BendStamp *)in_stack_fffffffffffffaa8);
          BendStamp::getOverridePars((BendStamp *)in_stack_fffffffffffffaa8);
          local_60 = BendTypeParser::parseTypeAndPars
                               ((BendTypeParser *)in_stack_fffffffffffffb30,
                                (string *)CONCAT17(uVar2,in_stack_fffffffffffffb28),
                                in_stack_fffffffffffffb20);
          std::vector<double,_std::allocator<double>_>::~vector
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffac0);
          std::__cxx11::string::~string(local_278);
        }
        else {
          (*(local_250->super_StuntDouble)._vptr_StuntDouble[7])(local_2d8);
          (**(code **)(*local_258 + 0x38))(local_2f8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffaf0,(char *)in_stack_fffffffffffffae8,
                     (allocator<char> *)in_stack_fffffffffffffae0);
          local_60 = ForceField::getBendType
                               (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                                in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          std::__cxx11::string::~string(local_318);
          std::allocator<char>::~allocator(&local_319);
          std::__cxx11::string::~string(local_2f8);
          std::__cxx11::string::~string(local_2d8);
          if (local_60 == (BendType *)0x0) {
            (*(local_250->super_StuntDouble)._vptr_StuntDouble[7])(local_340);
            uVar5 = std::__cxx11::string::c_str();
            (**(code **)(*local_258 + 0x38))(local_360);
            uVar6 = std::__cxx11::string::c_str();
            peVar12 = &painCave;
            snprintf(painCave.errMsg,2000,"Can not find Matching Bend Type for[%s, %s, %s]",uVar5,
                     uVar6,"GHOST");
            std::__cxx11::string::~string(local_360);
            std::__cxx11::string::~string(local_340);
            peVar12->isFatal = 1;
            simError();
          }
        }
        pBVar8 = (Bend *)operator_new(0x98);
        GhostBend::GhostBend
                  (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                   (DirectionalAtom *)in_stack_fffffffffffffab0,
                   (BendType *)in_stack_fffffffffffffaa8);
        local_68 = pBVar8;
      }
    }
  }
  this_00 = local_68;
  index = LocalIndexManager::getNextBendIndex((LocalIndexManager *)0x1e5e81);
  ShortRangeInteraction::setLocalIndex(&this_00->super_ShortRangeInteraction,index);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          Molecule::getNBends((Molecule *)0x1e5ea4);
  OpenMD_itoa_abi_cxx11_(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58);
  pBVar8 = local_68;
  Molecule::getType_abi_cxx11_(in_stack_fffffffffffffaa8);
  std::operator+(__lhs,(char *)pBVar8);
  std::__cxx11::string::c_str();
  std::operator+(__lhs,(char *)pBVar8);
  (*(pBVar8->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[3])(pBVar8,local_3a0);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3e0);
  pBVar8 = local_68;
  std::__cxx11::string::~string(local_380);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  BendTypeParser::~BendTypeParser((BendTypeParser *)0x1e5fa1);
  return pBVar8;
}

Assistant:

Bend* MoleculeCreator::createBend(ForceField* ff, Molecule* mol,
                                    BendStamp* stamp,
                                    LocalIndexManager* localIndexMan) {
    BendTypeParser btParser;
    BendType* bendType = NULL;
    Bend* bend         = NULL;

    std::vector<int> bendAtoms = stamp->getMembers();
    if (bendAtoms.size() == 3) {
      Atom* atomA = mol->getAtomAt(bendAtoms[0]);
      Atom* atomB = mol->getAtomAt(bendAtoms[1]);
      Atom* atomC = mol->getAtomAt(bendAtoms[2]);

      assert(atomA && atomB && atomC);

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType =
            ff->getBendType(atomA->getType().c_str(), atomB->getType().c_str(),
                            atomC->getType().c_str());

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   atomA->getType().c_str(), atomB->getType().c_str(),
                   atomC->getType().c_str());

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new Bend(atomA, atomB, atomC, bendType);

    } else if (bendAtoms.size() == 2 && stamp->haveGhostVectorSource()) {
      int ghostIndex = stamp->getGhostVectorSource();
      int normalIndex =
          ghostIndex != bendAtoms[0] ? bendAtoms[0] : bendAtoms[1];
      Atom* normalAtom = mol->getAtomAt(normalIndex);
      DirectionalAtom* ghostAtom =
          dynamic_cast<DirectionalAtom*>(mol->getAtomAt(ghostIndex));
      if (ghostAtom == NULL) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not cast Atom to DirectionalAtom");
        painCave.isFatal = 1;
        simError();
      }

      if (stamp->hasOverride()) {
        try {
          bendType = btParser.parseTypeAndPars(stamp->getOverrideType(),
                                               stamp->getOverridePars());
        } catch (OpenMDException& e) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MoleculeCreator Error: %s "
                   "for molecule %s\n",
                   e.what(), mol->getType().c_str());
          painCave.isFatal = 1;
          simError();
        }
      } else {
        bendType = ff->getBendType(normalAtom->getType(), ghostAtom->getType(),
                                   "GHOST");

        if (bendType == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not find Matching Bend Type for[%s, %s, %s]",
                   normalAtom->getType().c_str(), ghostAtom->getType().c_str(),
                   "GHOST");

          painCave.isFatal = 1;
          simError();
        }
      }

      bend = new GhostBend(normalAtom, ghostAtom, bendType);
    }

    // set the local index of this bend, the global index will be set later
    bend->setLocalIndex(localIndexMan->getNextBendIndex());

    // The rule for naming a bend is: MoleculeName_Bend_Integer
    // The first part is the name of the molecule
    // The second part is always fixed as "Bend"
    // The third part is the index of the bend defined in meta-data file
    // For example, Butane_Bend_0 is a valid Bend name in a butane molecule

    std::string s = OpenMD_itoa(mol->getNBends(), 10);
    bend->setName(mol->getType() + "_Bend_" + s.c_str());
    return bend;
  }